

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::dht_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,dht_error_alert *this)

{
  uint uVar1;
  error_category *peVar2;
  size_t sVar3;
  char *pcVar4;
  char msg [600];
  string local_2b8;
  string local_298;
  char local_278 [600];
  
  if ((ulong)this->op < 0x2b) {
    pcVar4 = operation_name::names[this->op];
  }
  else {
    pcVar4 = "unknown operation";
  }
  uVar1 = (this->error).val_;
  peVar2 = (this->error).cat_;
  (*peVar2->_vptr_error_category[4])(&local_2b8,peVar2,(ulong)uVar1);
  convert_from_native(&local_298,&local_2b8);
  snprintf(local_278,600,"DHT error [%s] (%d) %s",pcVar4,(ulong)uVar1,local_298._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(local_278);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_278,local_278 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string dht_error_alert::message() const
	{
		char msg[600];
		std::snprintf(msg, sizeof(msg), "DHT error [%s] (%d) %s"
			, operation_name(op)
			, error.value()
			, convert_from_native(error.message()).c_str());
		return msg;
	}